

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QEditorInfo * __thiscall
QAbstractItemViewPrivate::editorForIndex(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  const_iterator *this_00;
  QModelIndex *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QPersistentModelIndex *in_stack_ffffffffffffff98;
  QEditorInfo *in_stack_ffffffffffffffa0;
  QEditorInfo *local_38;
  QPersistentModelIndex local_20;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (editorForIndex(QModelIndex_const&)::nullInfo == '\0') {
    iVar2 = __cxa_guard_acquire(&editorForIndex(QModelIndex_const&)::nullInfo);
    if (iVar2 != 0) {
      QEditorInfo::QEditorInfo(in_stack_ffffffffffffffa0);
      __cxa_atexit(QEditorInfo::~QEditorInfo,&editorForIndex::nullInfo,&__dso_handle);
      __cxa_guard_release(&editorForIndex(QModelIndex_const&)::nullInfo);
    }
  }
  bVar1 = QHash<QPersistentModelIndex,_QEditorInfo>::isEmpty
                    ((QHash<QPersistentModelIndex,_QEditorInfo> *)(in_RDI + 0x348));
  if (bVar1) {
    local_38 = &editorForIndex::nullInfo;
  }
  else {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (const_iterator *)(in_RDI + 0x348);
    QPersistentModelIndex::QPersistentModelIndex(&local_20,in_RSI);
    local_18 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::find
                                ((QHash<QPersistentModelIndex,_QEditorInfo> *)
                                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QPersistentModelIndex::~QPersistentModelIndex(&local_20);
    QHash<QPersistentModelIndex,_QEditorInfo>::end
              ((QHash<QPersistentModelIndex,_QEditorInfo> *)this_00);
    bVar1 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator==
                      (this_00,(const_iterator *)in_stack_ffffffffffffffa0);
    if (bVar1) {
      local_38 = &editorForIndex::nullInfo;
    }
    else {
      local_38 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::value
                           ((const_iterator *)0x801ab0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

const QEditorInfo & QAbstractItemViewPrivate::editorForIndex(const QModelIndex &index) const
{
    static QEditorInfo nullInfo;

    // do not try to search to avoid slow implicit cast from QModelIndex to QPersistentModelIndex
    if (indexEditorHash.isEmpty())
        return nullInfo;

    QIndexEditorHash::const_iterator it = indexEditorHash.find(index);
    if (it == indexEditorHash.end())
        return nullInfo;

    return it.value();
}